

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# schema_compile_node.c
# Opt level: O0

LY_ERR lys_compile_type_union
                 (lysc_ctx *ctx,lysp_type *ptypes,lysp_node *context_pnode,uint16_t context_flags,
                 char *context_name,lysc_type ***utypes_p)

{
  int *piVar1;
  ulong local_160;
  long local_150;
  long local_140;
  long local_130;
  long local_110;
  long local_100;
  lysc_type **local_f8;
  long local_e8;
  long local_d8;
  ulong local_c0;
  long local_b0;
  long local_a0;
  long local_98;
  ulong local_80;
  uint64_t v;
  char *p___1;
  uint64_t additional;
  uint64_t u;
  char *p__;
  lysc_type_union *un_aux;
  lysc_type **utypes;
  LY_ERR ret;
  lysc_type ***utypes_p_local;
  char *context_name_local;
  uint16_t context_flags_local;
  lysp_node *context_pnode_local;
  lysp_type *ptypes_local;
  lysc_ctx *ctx_local;
  
  un_aux = (lysc_type_union *)*utypes_p;
  p__ = (char *)0x0;
  if (un_aux == (lysc_type_union *)0x0) {
    if (ptypes == (lysp_type *)0x0) {
      local_a0 = 0;
    }
    else {
      local_a0._0_1_ = ptypes[-1].fraction_digits;
      local_a0._1_1_ = ptypes[-1].require_instance;
      local_a0._2_2_ = ptypes[-1].flags;
      local_a0._4_4_ = *(undefined4 *)&ptypes[-1].field_0x64;
    }
    u = (uint64_t)calloc(1,local_a0 * 8 + 8);
    if ((void *)u != (void *)0x0) goto LAB_001774ef;
    ly_log(ctx->ctx,LY_LLERR,LY_EMEM,"Memory allocation failed (%s()).","lys_compile_type_union");
    utypes._4_4_ = LY_EMEM;
  }
  else {
    if (ptypes == (lysp_type *)0x0) {
      local_98 = 0;
    }
    else {
      local_98._0_1_ = ptypes[-1].fraction_digits;
      local_98._1_1_ = ptypes[-1].require_instance;
      local_98._2_2_ = ptypes[-1].flags;
      local_98._4_4_ = *(undefined4 *)&ptypes[-1].field_0x64;
    }
    u = (uint64_t)realloc(&un_aux[-1].types,((long)un_aux[-1].types + local_98) * 8 + 8);
    if ((void *)u != (void *)0x0) {
LAB_001774ef:
      un_aux = (lysc_type_union *)(u + 8);
      if (un_aux != (lysc_type_union *)0x0) {
        if (ptypes == (lysp_type *)0x0) {
          local_b0 = 0;
        }
        else {
          local_b0._0_1_ = ptypes[-1].fraction_digits;
          local_b0._1_1_ = ptypes[-1].require_instance;
          local_b0._2_2_ = ptypes[-1].flags;
          local_b0._4_4_ = *(undefined4 *)&ptypes[-1].field_0x64;
        }
        memset(&un_aux->name + *(long *)u,0,local_b0 << 3);
      }
      additional = 0;
      p___1 = (char *)0x0;
      do {
        p__ = (char *)0x0;
        if (ptypes == (lysp_type *)0x0) {
          local_c0 = 0;
        }
        else {
          local_c0._0_1_ = ptypes[-1].fraction_digits;
          local_c0._1_1_ = ptypes[-1].require_instance;
          local_c0._2_2_ = ptypes[-1].flags;
          local_c0._4_4_ = *(undefined4 *)&ptypes[-1].field_0x64;
        }
        if (local_c0 <= additional) {
          *utypes_p = (lysc_type **)un_aux;
          return LY_SUCCESS;
        }
        utypes._4_4_ = lys_compile_type(ctx,context_pnode,context_flags,context_name,
                                        ptypes + additional,
                                        (lysc_type **)(&un_aux->name + (long)(p___1 + additional)),
                                        (char **)0x0,(lysp_qname **)0x0);
        if (utypes._4_4_ != LY_SUCCESS) goto LAB_00177a8b;
        LOCK();
        *(int *)((&un_aux->name)[(long)(p___1 + additional)] + 0x1c) =
             *(int *)((&un_aux->name)[(long)(p___1 + additional)] + 0x1c) + 1;
        UNLOCK();
        if (*(int *)((&un_aux->name)[(long)(p___1 + additional)] + 0x18) == 0xf) {
          p__ = (&un_aux->name)[(long)(p___1 + additional)];
          if (un_aux == (lysc_type_union *)0x0) {
            if (ptypes == (lysp_type *)0x0) {
              local_100 = 0;
            }
            else {
              local_100._0_1_ = ptypes[-1].fraction_digits;
              local_100._1_1_ = ptypes[-1].require_instance;
              local_100._2_2_ = ptypes[-1].flags;
              local_100._4_4_ = *(undefined4 *)&ptypes[-1].field_0x64;
            }
            if (((lysc_type *)((long)p__ + 0x20))->name == (char *)0x0) {
              local_110 = 0;
            }
            else {
              local_110 = *(long *)(((lysc_type *)((long)p__ + 0x20))->name + -8);
            }
            v = (uint64_t)calloc(1,(long)(p___1 + local_110 + local_100) * 8 + 8);
            if ((void *)v == (void *)0x0) {
              ly_log(ctx->ctx,LY_LLERR,LY_EMEM,"Memory allocation failed (%s()).",
                     "lys_compile_type_union");
              utypes._4_4_ = LY_EMEM;
              goto LAB_00177a8b;
            }
          }
          else {
            if (ptypes == (lysp_type *)0x0) {
              local_d8 = 0;
            }
            else {
              local_d8._0_1_ = ptypes[-1].fraction_digits;
              local_d8._1_1_ = ptypes[-1].require_instance;
              local_d8._2_2_ = ptypes[-1].flags;
              local_d8._4_4_ = *(undefined4 *)&ptypes[-1].field_0x64;
            }
            if (((lysc_type *)((long)p__ + 0x20))->name == (char *)0x0) {
              local_e8 = 0;
            }
            else {
              local_e8 = *(long *)(((lysc_type *)((long)p__ + 0x20))->name + -8);
            }
            if (un_aux == (lysc_type_union *)0x0) {
              local_f8 = (lysc_type **)0x0;
            }
            else {
              local_f8 = un_aux[-1].types;
            }
            v = (uint64_t)
                realloc(&un_aux[-1].types,
                        (long)((long)un_aux[-1].types +
                              (long)(p___1 + ((local_e8 + local_d8) - (long)local_f8))) * 8 + 8);
            if ((void *)v == (void *)0x0) {
              ly_log(ctx->ctx,LY_LLERR,LY_EMEM,"Memory allocation failed (%s()).",
                     "lys_compile_type_union");
              utypes._4_4_ = LY_EMEM;
              goto LAB_00177a8b;
            }
          }
          un_aux = (lysc_type_union *)(v + 8);
          if (un_aux != (lysc_type_union *)0x0) {
            if (ptypes == (lysp_type *)0x0) {
              local_130 = 0;
            }
            else {
              local_130._0_1_ = ptypes[-1].fraction_digits;
              local_130._1_1_ = ptypes[-1].require_instance;
              local_130._2_2_ = ptypes[-1].flags;
              local_130._4_4_ = *(undefined4 *)&ptypes[-1].field_0x64;
            }
            if (((lysc_type *)((long)p__ + 0x20))->name == (char *)0x0) {
              local_140 = 0;
            }
            else {
              local_140 = *(long *)(((lysc_type *)((long)p__ + 0x20))->name + -8);
            }
            if (un_aux == (lysc_type_union *)0x0) {
              local_150 = 0;
            }
            else {
              local_150 = *(long *)v;
            }
            memset(&un_aux->name + *(long *)v,0,
                   (long)(p___1 + ((local_140 + local_130) - local_150)) * 8);
          }
          local_80 = 0;
          while( true ) {
            if (((lysc_type *)((long)p__ + 0x20))->name == (char *)0x0) {
              local_160 = 0;
            }
            else {
              local_160 = *(ulong *)(((lysc_type *)((long)p__ + 0x20))->name + -8);
            }
            if (local_160 <= local_80) break;
            (&un_aux->name)[(long)(p___1 + additional)] =
                 *(char **)(((lysc_type *)((long)p__ + 0x20))->name + local_80 * 8);
            LOCK();
            piVar1 = (int *)(*(long *)(((lysc_type *)((long)p__ + 0x20))->name + local_80 * 8) +
                            0x1c);
            *piVar1 = *piVar1 + 1;
            UNLOCK();
            p___1 = p___1 + 1;
            *(long *)v = *(long *)v + 1;
            local_80 = local_80 + 1;
          }
          p___1 = p___1 + -1;
          lysc_type_free(&ctx->free_ctx,(lysc_type *)p__);
        }
        else {
          un_aux[-1].types = (lysc_type **)((long)un_aux[-1].types + 1);
        }
        additional = additional + 1;
      } while( true );
    }
    ly_log(ctx->ctx,LY_LLERR,LY_EMEM,"Memory allocation failed (%s()).","lys_compile_type_union");
    utypes._4_4_ = LY_EMEM;
  }
LAB_00177a8b:
  if (p__ != (char *)0x0) {
    lysc_type_free(&ctx->free_ctx,(lysc_type *)p__);
  }
  *utypes_p = (lysc_type **)un_aux;
  return utypes._4_4_;
}

Assistant:

static LY_ERR
lys_compile_type_union(struct lysc_ctx *ctx, struct lysp_type *ptypes, struct lysp_node *context_pnode, uint16_t context_flags,
        const char *context_name, struct lysc_type ***utypes_p)
{
    LY_ERR ret = LY_SUCCESS;
    struct lysc_type **utypes = *utypes_p;
    struct lysc_type_union *un_aux = NULL;

    LY_ARRAY_CREATE_GOTO(ctx->ctx, utypes, LY_ARRAY_COUNT(ptypes), ret, error);
    for (LY_ARRAY_COUNT_TYPE u = 0, additional = 0; u < LY_ARRAY_COUNT(ptypes); ++u) {
        ret = lys_compile_type(ctx, context_pnode, context_flags, context_name, &ptypes[u], &utypes[u + additional],
                NULL, NULL);
        LY_CHECK_GOTO(ret, error);
        LY_ATOMIC_INC_BARRIER(utypes[u + additional]->refcount);

        if (utypes[u + additional]->basetype == LY_TYPE_UNION) {
            /* add space for additional types from the union subtype */
            un_aux = (struct lysc_type_union *)utypes[u + additional];
            LY_ARRAY_CREATE_GOTO(ctx->ctx, utypes,
                    LY_ARRAY_COUNT(ptypes) + additional + LY_ARRAY_COUNT(un_aux->types) - LY_ARRAY_COUNT(utypes), ret, error);

            /* copy subtypes of the subtype union */
            for (LY_ARRAY_COUNT_TYPE v = 0; v < LY_ARRAY_COUNT(un_aux->types); ++v) {
                utypes[u + additional] = un_aux->types[v];
                LY_ATOMIC_INC_BARRIER(un_aux->types[v]->refcount);
                ++additional;
                LY_ARRAY_INCREMENT(utypes);
            }
            /* compensate u increment in main loop */
            --additional;

            /* free the replaced union subtype */
            lysc_type_free(&ctx->free_ctx, (struct lysc_type *)un_aux);
            un_aux = NULL;
        } else {
            LY_ARRAY_INCREMENT(utypes);
        }
    }

    *utypes_p = utypes;
    return LY_SUCCESS;

error:
    if (un_aux) {
        lysc_type_free(&ctx->free_ctx, (struct lysc_type *)un_aux);
    }
    *utypes_p = utypes;
    return ret;
}